

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGeometryUtil.cpp
# Opt level: O1

void cbtGeometryUtil::getVerticesFromPlaneEquations
               (cbtAlignedObjectArray<cbtVector3> *planeEquations,
               cbtAlignedObjectArray<cbtVector3> *verticesOut)

{
  ulong uVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  int iVar10;
  int iVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined8 uVar20;
  bool bVar21;
  cbtVector3 *pcVar22;
  long lVar23;
  int iVar24;
  ulong uVar25;
  cbtVector3 *pcVar26;
  cbtVector3 *pcVar27;
  ulong uVar28;
  long lVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  undefined1 auVar34 [64];
  cbtVector3 local_78;
  cbtAlignedObjectArray<cbtVector3> *local_68;
  int local_5c;
  ulong local_58;
  long local_50;
  ulong local_48;
  long local_40;
  ulong local_38;
  
  iVar10 = planeEquations->m_size;
  uVar28 = (ulong)iVar10;
  if (0 < (long)uVar28) {
    local_50 = 2;
    local_58 = 1;
    local_48 = 0;
    auVar34 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
    local_68 = verticesOut;
    do {
      uVar1 = local_48 + 1;
      if (uVar1 < uVar28) {
        pcVar27 = planeEquations->m_data + local_48;
        lVar23 = local_50;
        uVar25 = local_58;
        local_48 = uVar1;
        do {
          local_38 = uVar25 + 1;
          if ((int)local_38 < iVar10) {
            pcVar26 = planeEquations->m_data + uVar25;
            lVar29 = lVar23;
            local_40 = lVar23;
            do {
              pcVar22 = planeEquations->m_data;
              fVar33 = pcVar26->m_floats[0];
              fVar4 = pcVar26->m_floats[1];
              fVar31 = pcVar22[lVar29].m_floats[2];
              fVar5 = pcVar26->m_floats[2];
              fVar32 = pcVar22[lVar29].m_floats[0];
              fVar6 = pcVar22[lVar29].m_floats[1];
              auVar13 = vfmsub231ss_fma(ZEXT416((uint)(fVar6 * fVar5)),ZEXT416((uint)fVar4),
                                        ZEXT416((uint)fVar31));
              auVar14 = vfmsub231ss_fma(ZEXT416((uint)(fVar33 * fVar31)),ZEXT416((uint)fVar5),
                                        ZEXT416((uint)fVar32));
              auVar15 = vfmsub231ss_fma(ZEXT416((uint)(fVar32 * fVar4)),ZEXT416((uint)fVar33),
                                        ZEXT416((uint)fVar6));
              fVar30 = auVar14._0_4_;
              auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar30 * fVar30)),auVar13,auVar13);
              auVar14 = vfmadd231ss_fma(auVar14,auVar15,auVar15);
              if (0.0001 < auVar14._0_4_) {
                fVar7 = pcVar27->m_floats[2];
                fVar8 = pcVar27->m_floats[0];
                fVar9 = pcVar27->m_floats[1];
                auVar16 = vfmsub231ss_fma(ZEXT416((uint)(fVar9 * fVar31)),ZEXT416((uint)fVar6),
                                          ZEXT416((uint)fVar7));
                auVar14 = vfmsub231ss_fma(ZEXT416((uint)(fVar32 * fVar7)),ZEXT416((uint)fVar8),
                                          ZEXT416((uint)fVar31));
                auVar17 = vfmsub231ss_fma(ZEXT416((uint)(fVar8 * fVar6)),ZEXT416((uint)fVar9),
                                          ZEXT416((uint)fVar32));
                fVar31 = auVar14._0_4_;
                auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar31 * fVar31)),auVar16,auVar16);
                auVar14 = vfmadd231ss_fma(auVar14,auVar17,auVar17);
                if (0.0001 < auVar14._0_4_) {
                  auVar18 = vfmsub231ss_fma(ZEXT416((uint)(fVar4 * fVar7)),ZEXT416((uint)fVar9),
                                            ZEXT416((uint)fVar5));
                  auVar14 = vfmsub231ss_fma(ZEXT416((uint)(fVar5 * fVar8)),ZEXT416((uint)fVar7),
                                            ZEXT416((uint)fVar33));
                  auVar19 = vfmsub231ss_fma(ZEXT416((uint)(fVar33 * fVar9)),ZEXT416((uint)fVar8),
                                            ZEXT416((uint)fVar4));
                  fVar33 = auVar14._0_4_;
                  auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar33 * fVar33)),auVar18,auVar18);
                  auVar14 = vfmadd231ss_fma(auVar14,auVar19,auVar19);
                  if (0.0001 < auVar14._0_4_) {
                    auVar12 = vfmadd213ss_fma(ZEXT416((uint)fVar8),auVar13,
                                              ZEXT416((uint)(fVar9 * fVar30)));
                    auVar12 = vfmadd213ss_fma(ZEXT416((uint)fVar7),auVar15,auVar12);
                    vandps_avx(auVar34._0_16_,auVar12);
                    vucomiss_avx512f(SUB6416(ZEXT464(0x358637bd),0));
                    if (0.0001 < auVar14._0_4_) {
                      fVar32 = -1.0 / auVar12._0_4_;
                      fVar4 = pcVar27->m_floats[3];
                      auVar14 = vinsertps_avx(ZEXT416((uint)(auVar13._0_4_ * fVar4)),
                                              ZEXT416((uint)(fVar30 * fVar4)),0x10);
                      auVar14 = vinsertps_avx(auVar14,ZEXT416((uint)(auVar15._0_4_ * fVar4)),0x28);
                      fVar4 = pcVar26->m_floats[3];
                      fVar5 = pcVar22[lVar29].m_floats[3];
                      local_78.m_floats[0] = auVar14._0_4_;
                      local_78.m_floats[1] = auVar14._4_4_;
                      local_78.m_floats[2] = auVar14._8_4_;
                      local_78.m_floats[1] =
                           fVar32 * (fVar33 * fVar5 + fVar31 * fVar4 + local_78.m_floats[1]);
                      local_78.m_floats[0] =
                           fVar32 * (auVar18._0_4_ * fVar5 +
                                    auVar16._0_4_ * fVar4 + local_78.m_floats[0]);
                      local_78.m_floats[3] = auVar14._12_4_;
                      local_78.m_floats[2] =
                           fVar32 * (auVar19._0_4_ * fVar5 +
                                    auVar17._0_4_ * fVar4 + local_78.m_floats[2]);
                      bVar21 = isPointInsidePlanes(planeEquations,&local_78,0.01);
                      if (bVar21) {
                        iVar11 = local_68->m_size;
                        if (iVar11 == local_68->m_capacity) {
                          iVar24 = iVar11 * 2;
                          if (iVar11 == 0) {
                            iVar24 = 1;
                          }
                          if (local_68->m_capacity < iVar24) {
                            local_5c = iVar24;
                            if (iVar24 == 0) {
                              pcVar22 = (cbtVector3 *)0x0;
                            }
                            else {
                              pcVar22 = (cbtVector3 *)
                                        cbtAlignedAllocInternal((long)iVar24 << 4,0x10);
                            }
                            iVar11 = local_68->m_size;
                            if (0 < (long)iVar11) {
                              lVar23 = 0;
                              do {
                                puVar2 = (undefined8 *)((long)local_68->m_data->m_floats + lVar23);
                                uVar20 = puVar2[1];
                                puVar3 = (undefined8 *)((long)pcVar22->m_floats + lVar23);
                                *puVar3 = *puVar2;
                                puVar3[1] = uVar20;
                                lVar23 = lVar23 + 0x10;
                              } while ((long)iVar11 * 0x10 != lVar23);
                            }
                            if (local_68->m_data != (cbtVector3 *)0x0) {
                              if (local_68->m_ownsMemory == true) {
                                cbtAlignedFreeInternal(local_68->m_data);
                              }
                              local_68->m_data = (cbtVector3 *)0x0;
                            }
                            local_68->m_ownsMemory = true;
                            local_68->m_data = pcVar22;
                            local_68->m_capacity = local_5c;
                          }
                        }
                        pcVar22 = local_68->m_data;
                        iVar11 = local_68->m_size;
                        *(undefined8 *)pcVar22[iVar11].m_floats = local_78.m_floats._0_8_;
                        *(undefined8 *)(pcVar22[iVar11].m_floats + 2) = local_78.m_floats._8_8_;
                        local_68->m_size = local_68->m_size + 1;
                      }
                      auVar34 = ZEXT1664(CONCAT412(0x7fffffff,
                                                   CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                      lVar23 = local_40;
                    }
                  }
                }
              }
              lVar29 = lVar29 + 1;
            } while ((int)lVar29 < iVar10);
          }
          lVar23 = lVar23 + 1;
          uVar25 = local_38;
          uVar1 = local_48;
        } while (local_38 != uVar28);
      }
      local_48 = uVar1;
      local_50 = local_50 + 1;
      local_58 = local_58 + 1;
    } while (local_48 != uVar28);
  }
  return;
}

Assistant:

void cbtGeometryUtil::getVerticesFromPlaneEquations(const cbtAlignedObjectArray<cbtVector3>& planeEquations, cbtAlignedObjectArray<cbtVector3>& verticesOut)
{
	const int numbrushes = planeEquations.size();
	// brute force:
	for (int i = 0; i < numbrushes; i++)
	{
		const cbtVector3& N1 = planeEquations[i];

		for (int j = i + 1; j < numbrushes; j++)
		{
			const cbtVector3& N2 = planeEquations[j];

			for (int k = j + 1; k < numbrushes; k++)
			{
				const cbtVector3& N3 = planeEquations[k];

				cbtVector3 n2n3;
				n2n3 = N2.cross(N3);
				cbtVector3 n3n1;
				n3n1 = N3.cross(N1);
				cbtVector3 n1n2;
				n1n2 = N1.cross(N2);

				if ((n2n3.length2() > cbtScalar(0.0001)) &&
					(n3n1.length2() > cbtScalar(0.0001)) &&
					(n1n2.length2() > cbtScalar(0.0001)))
				{
					//point P out of 3 plane equations:

					//	d1 ( N2 * N3 ) + d2 ( N3 * N1 ) + d3 ( N1 * N2 )
					//P =  -------------------------------------------------------------------------
					//   N1 . ( N2 * N3 )

					cbtScalar quotient = (N1.dot(n2n3));
					if (cbtFabs(quotient) > cbtScalar(0.000001))
					{
						quotient = cbtScalar(-1.) / quotient;
						n2n3 *= N1[3];
						n3n1 *= N2[3];
						n1n2 *= N3[3];
						cbtVector3 potentialVertex = n2n3;
						potentialVertex += n3n1;
						potentialVertex += n1n2;
						potentialVertex *= quotient;

						//check if inside, and replace supportingVertexOut if needed
						if (isPointInsidePlanes(planeEquations, potentialVertex, cbtScalar(0.01)))
						{
							verticesOut.push_back(potentialVertex);
						}
					}
				}
			}
		}
	}
}